

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::eventsChecker::ZEeventsChecker::zeCommandListAppendMemoryFillPrologue
          (ZEeventsChecker *this,ze_command_list_handle_t hCommandList,void *ptr,void *pattern,
          size_t pattern_size,size_t size,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"zeCommandListAppendMemoryFill",&local_49);
  checkForDeadlock(this,&local_48,hSignalEvent,numWaitEvents,phWaitEvents);
  std::__cxx11::string::~string((string *)&local_48);
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
eventsChecker::ZEeventsChecker::zeCommandListAppendMemoryFillPrologue(
    ze_command_list_handle_t hCommandList, ///< [in] handle of command list
    void *ptr,                             ///< [in] pointer to memory to initialize
    const void *pattern,                   ///< [in] pointer to value to initialize memory to
    size_t pattern_size,                   ///< [in] size in bytes of the value to initialize memory to
    size_t size,                           ///< [in] size in bytes to initialize
    ze_event_handle_t hSignalEvent,        ///< [in][optional] handle of the event to signal on completion
    uint32_t numWaitEvents,                ///< [in][optional] number of events to wait on before launching; must be 0
                                           ///< if `nullptr == phWaitEvents`
    ze_event_handle_t *phWaitEvents        ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                           ///< on before launching
) {
    checkForDeadlock("zeCommandListAppendMemoryFill", hSignalEvent, numWaitEvents, phWaitEvents);
    return ZE_RESULT_SUCCESS;
}